

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile.cc
# Opt level: O1

int32_t WebRtcAecm_Process(void *aecmInst,int16_t *nearendNoisy,int16_t *nearendClean,int16_t *out,
                          size_t nrOfSamples,int16_t msInSndCardBuf)

{
  RingBuffer *self;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  short sVar5;
  int16_t *nearendClean_00;
  undefined2 uVar6;
  int32_t iVar7;
  short sVar8;
  int iVar9;
  int16_t iVar10;
  long lVar11;
  double dVar12;
  int16_t *farend_ptr;
  int16_t farend [80];
  int16_t *local_f8;
  int16_t *local_f0;
  int32_t local_e4;
  ulong local_e0;
  int16_t local_d8 [84];
  
  if (aecmInst == (void *)0x0) {
    return -1;
  }
  if (out == (int16_t *)0x0 || nearendNoisy == (int16_t *)0x0) {
    return 0x2ee3;
  }
  if (*(short *)((long)aecmInst + 0x150) != 0x2a) {
    return 0x2ee2;
  }
  if ((nrOfSamples != 0xa0) && (nrOfSamples != 0x50)) {
    return 0x2ee4;
  }
  iVar10 = msInSndCardBuf;
  if (499 < msInSndCardBuf) {
    iVar10 = 500;
  }
  iVar7 = 0x2f44;
  if ((ushort)msInSndCardBuf < 0x1f5) {
    iVar7 = 0;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  *(int16_t *)((long)aecmInst + 0x15a) = iVar10 + 10;
  local_e0 = nrOfSamples / 0x50;
  uVar3 = local_e0 / (ulong)(long)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238);
  if (*(int *)((long)aecmInst + 0x164) == 0) {
    if (nrOfSamples < 0x50) {
      return iVar7;
    }
    lVar11 = 0;
    uVar3 = 0;
    local_f0 = out;
    local_e4 = iVar7;
    do {
      local_f8 = (int16_t *)0x0;
      sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
      if ((short)sVar4 < 0x50) {
        memcpy(local_d8,(void *)((long)aecmInst + lVar11 + 0x10),0xa0);
        out = local_f0;
        local_f8 = local_d8;
      }
      else {
        WebRtc_ReadBuffer(*(RingBuffer **)((long)aecmInst + 0x178),&local_f8,local_d8,0x50);
        memcpy((void *)((long)aecmInst + lVar11 + 0x10),local_f8,0xa0);
      }
      if (uVar3 == 1) {
        if (*aecmInst == 16000) goto LAB_0016b569;
      }
      else if ((uVar3 == 0) && (*aecmInst == 8000)) {
LAB_0016b569:
        sVar8 = *(short *)((long)aecmInst + 0x15a);
        sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
        sVar8 = sVar8 * *(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) * 8 - (short)sVar4;
        if (sVar8 < 0x50) {
          WebRtc_MoveReadPtr(*(RingBuffer **)((long)aecmInst + 0x178),0x50);
          sVar8 = sVar8 + 0x50;
        }
        iVar9 = sVar8 * 2 + *(short *)((long)aecmInst + 0x15c) * 8;
        sVar8 = (short)(uint)((ulong)((long)iVar9 * 0x66666667) >> 0x22) - (short)(iVar9 >> 0x1f);
        if (iVar9 < -9) {
          sVar8 = 0;
        }
        *(short *)((long)aecmInst + 0x15c) = sVar8;
        sVar5 = sVar8 - (short)*(int *)((long)aecmInst + 0xc);
        if (sVar5 < 0xe1) {
          if (((*(int *)((long)aecmInst + 0xc) < 1) || (0x5f < sVar5)) ||
             (0xe0 < *(short *)((long)aecmInst + 0x170))) goto LAB_0016b626;
LAB_0016b632:
          *(int *)((long)aecmInst + 0x160) = *(int *)((long)aecmInst + 0x160) + 1;
        }
        else {
          if (0x5f < *(short *)((long)aecmInst + 0x170)) goto LAB_0016b632;
LAB_0016b626:
          *(undefined4 *)((long)aecmInst + 0x160) = 0;
        }
        *(short *)((long)aecmInst + 0x170) = sVar5;
        out = local_f0;
        if (0x19 < *(int *)((long)aecmInst + 0x160)) {
          if (sVar8 < 0xa1) {
            iVar9 = 0;
          }
          else {
            iVar9 = sVar8 + -0xa0;
          }
          *(int *)((long)aecmInst + 0xc) = iVar9;
        }
      }
      nearendClean_00 = (int16_t *)((long)nearendClean + lVar11);
      if (nearendClean == (int16_t *)0x0) {
        nearendClean_00 = (int16_t *)0x0;
      }
      iVar9 = WebRtcAecm_ProcessFrame
                        (*(AecmCore **)((long)aecmInst + 0x180),local_f8,
                         (int16_t *)((long)nearendNoisy + lVar11),nearendClean_00,
                         (int16_t *)((long)out + lVar11));
      if (iVar9 == -1) {
        return -1;
      }
      uVar3 = uVar3 + 1;
      lVar11 = lVar11 + 0xa0;
      if (local_e0 == uVar3) {
        return local_e4;
      }
    } while( true );
  }
  if (nearendClean == (int16_t *)0x0) {
    nearendClean = nearendNoisy;
    if (out == nearendNoisy) goto LAB_0016b409;
  }
  else if (out == nearendClean) goto LAB_0016b409;
  memcpy(out,nearendClean,nrOfSamples * 2);
LAB_0016b409:
  sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
  if (*(int *)((long)aecmInst + 0x168) != 0) {
    sVar8 = (short)*(undefined4 *)((long)aecmInst + 0x158) + 1;
    *(short *)((long)aecmInst + 0x158) = sVar8;
    if (*(short *)((long)aecmInst + 0x152) == 0) {
      *(undefined2 *)((long)aecmInst + 0x156) = *(undefined2 *)((long)aecmInst + 0x15a);
      *(undefined2 *)((long)aecmInst + 0x154) = 0;
    }
    iVar9 = (int)*(short *)((long)aecmInst + 0x15a);
    uVar2 = *(short *)((long)aecmInst + 0x156) - iVar9;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    dVar12 = (double)iVar9 * 0.2;
    if (dVar12 <= 8.0) {
      dVar12 = 8.0;
    }
    if (dVar12 <= (double)(uVar1 & 0xffff)) {
      sVar5 = 0;
    }
    else {
      *(short *)((long)aecmInst + 0x154) =
           *(short *)((long)aecmInst + 0x154) + *(short *)((long)aecmInst + 0x15a);
      sVar5 = *(short *)((long)aecmInst + 0x152) + 1;
    }
    *(short *)((long)aecmInst + 0x152) = sVar5;
    if (5 < (long)sVar5 * uVar3) {
      lVar11 = (long)((int)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) *
                      (int)*(short *)((long)aecmInst + 0x154) * 3) / (long)(sVar5 * 0x28);
      uVar6 = 0x32;
      if ((int)lVar11 < 0x32) {
        uVar6 = (undefined2)lVar11;
      }
      *(undefined2 *)((long)aecmInst + 8) = uVar6;
      *(undefined4 *)((long)aecmInst + 0x168) = 0;
    }
    if (0x32 < uVar3 * (long)sVar8) {
      iVar9 = iVar9 * *(short *)(*(long *)((long)aecmInst + 0x180) + 0x238) * 3;
      sVar8 = 0x32;
      if (iVar9 < 2000) {
        sVar8 = (short)(uint)((ulong)((long)iVar9 * 0x66666667) >> 0x24) - (short)(iVar9 >> 0x1f);
      }
      *(short *)((long)aecmInst + 8) = sVar8;
      *(undefined4 *)((long)aecmInst + 0x168) = 0;
    }
  }
  if (*(int *)((long)aecmInst + 0x168) == 0) {
    iVar9 = (int)(short)sVar4 / 0x50;
    if (iVar9 != *(short *)((long)aecmInst + 8)) {
      if (iVar9 <= *(short *)((long)aecmInst + 8)) {
        return iVar7;
      }
      self = *(RingBuffer **)((long)aecmInst + 0x178);
      sVar4 = WebRtc_available_read(self);
      WebRtc_MoveReadPtr(self,(int)sVar4 + *(short *)((long)aecmInst + 8) * -0x50);
    }
    *(undefined4 *)((long)aecmInst + 0x164) = 0;
  }
  return iVar7;
}

Assistant:

int32_t WebRtcAecm_Process(void *aecmInst, const int16_t *nearendNoisy,
                           const int16_t *nearendClean, int16_t *out,
                           size_t nrOfSamples, int16_t msInSndCardBuf)
{
    AecMobile* aecm = static_cast<AecMobile*>(aecmInst);
    int32_t retVal = 0;
    size_t i;
    short nmbrOfFilledBuffers;
    size_t nBlocks10ms;
    size_t nFrames;
#ifdef AEC_DEBUG
    short msInAECBuf;
#endif

    if (aecm == NULL)
    {
        return -1;
    }

    if (nearendNoisy == NULL)
    {
        return AECM_NULL_POINTER_ERROR;
    }

    if (out == NULL)
    {
        return AECM_NULL_POINTER_ERROR;
    }

    if (aecm->initFlag != kInitCheck)
    {
        return AECM_UNINITIALIZED_ERROR;
    }

    if (nrOfSamples != 80 && nrOfSamples != 160)
    {
        return AECM_BAD_PARAMETER_ERROR;
    }

    if (msInSndCardBuf < 0)
    {
        msInSndCardBuf = 0;
        retVal = AECM_BAD_PARAMETER_WARNING;
    } else if (msInSndCardBuf > 500)
    {
        msInSndCardBuf = 500;
        retVal = AECM_BAD_PARAMETER_WARNING;
    }
    msInSndCardBuf += 10;
    aecm->msInSndCardBuf = msInSndCardBuf;

    nFrames = nrOfSamples / FRAME_LEN;
    nBlocks10ms = nFrames / aecm->aecmCore->mult;

    if (aecm->ECstartup)
    {
        if (nearendClean == NULL)
        {
            if (out != nearendNoisy)
            {
                memcpy(out, nearendNoisy, sizeof(short) * nrOfSamples);
            }
        } else if (out != nearendClean)
        {
            memcpy(out, nearendClean, sizeof(short) * nrOfSamples);
        }

        nmbrOfFilledBuffers =
            (short) WebRtc_available_read(aecm->farendBuf) / FRAME_LEN;
        // The AECM is in the start up mode
        // AECM is disabled until the soundcard buffer and farend buffers are OK

        // Mechanism to ensure that the soundcard buffer is reasonably stable.
        if (aecm->checkBuffSize)
        {
            aecm->checkBufSizeCtr++;
            // Before we fill up the far end buffer we require the amount of data on the
            // sound card to be stable (+/-8 ms) compared to the first value. This
            // comparison is made during the following 4 consecutive frames. If it seems
            // to be stable then we start to fill up the far end buffer.

            if (aecm->counter == 0)
            {
                aecm->firstVal = aecm->msInSndCardBuf;
                aecm->sum = 0;
            }

            if (abs(aecm->firstVal - aecm->msInSndCardBuf)
                    < WEBRTC_SPL_MAX(0.2 * aecm->msInSndCardBuf, kSampMsNb))
            {
                aecm->sum += aecm->msInSndCardBuf;
                aecm->counter++;
            } else
            {
                aecm->counter = 0;
            }

            if (aecm->counter * nBlocks10ms >= 6)
            {
                // The farend buffer size is determined in blocks of 80 samples
                // Use 75% of the average value of the soundcard buffer
                aecm->bufSizeStart
                        = WEBRTC_SPL_MIN((3 * aecm->sum
                                        * aecm->aecmCore->mult) / (aecm->counter * 40), BUF_SIZE_FRAMES);
                // buffersize has now been determined
                aecm->checkBuffSize = 0;
            }

            if (aecm->checkBufSizeCtr * nBlocks10ms > 50)
            {
                // for really bad sound cards, don't disable echocanceller for more than 0.5 sec
                aecm->bufSizeStart = WEBRTC_SPL_MIN((3 * aecm->msInSndCardBuf
                                * aecm->aecmCore->mult) / 40, BUF_SIZE_FRAMES);
                aecm->checkBuffSize = 0;
            }
        }

        // if checkBuffSize changed in the if-statement above
        if (!aecm->checkBuffSize)
        {
            // soundcard buffer is now reasonably stable
            // When the far end buffer is filled with approximately the same amount of
            // data as the amount on the sound card we end the start up phase and start
            // to cancel echoes.

            if (nmbrOfFilledBuffers == aecm->bufSizeStart)
            {
                aecm->ECstartup = 0; // Enable the AECM
            } else if (nmbrOfFilledBuffers > aecm->bufSizeStart)
            {
                WebRtc_MoveReadPtr(aecm->farendBuf,
                                   (int) WebRtc_available_read(aecm->farendBuf)
                                   - (int) aecm->bufSizeStart * FRAME_LEN);
                aecm->ECstartup = 0;
            }
        }

    } else
    {
        // AECM is enabled

        // Note only 1 block supported for nb and 2 blocks for wb
        for (i = 0; i < nFrames; i++)
        {
            int16_t farend[FRAME_LEN];
            const int16_t* farend_ptr = NULL;

            nmbrOfFilledBuffers =
                (short) WebRtc_available_read(aecm->farendBuf) / FRAME_LEN;

            // Check that there is data in the far end buffer
            if (nmbrOfFilledBuffers > 0)
            {
                // Get the next 80 samples from the farend buffer
                WebRtc_ReadBuffer(aecm->farendBuf, (void**) &farend_ptr, farend,
                                  FRAME_LEN);

                // Always store the last frame for use when we run out of data
                memcpy(&(aecm->farendOld[i][0]), farend_ptr,
                       FRAME_LEN * sizeof(short));
            } else
            {
                // We have no data so we use the last played frame
                memcpy(farend, &(aecm->farendOld[i][0]), FRAME_LEN * sizeof(short));
                farend_ptr = farend;
            }

            // Call buffer delay estimator when all data is extracted,
            // i,e. i = 0 for NB and i = 1 for WB
            if ((i == 0 && aecm->sampFreq == 8000) || (i == 1 && aecm->sampFreq == 16000))
            {
                WebRtcAecm_EstBufDelay(aecm, aecm->msInSndCardBuf);
            }

            // Call the AECM
            /*WebRtcAecm_ProcessFrame(aecm->aecmCore, farend, &nearend[FRAME_LEN * i],
             &out[FRAME_LEN * i], aecm->knownDelay);*/
            if (WebRtcAecm_ProcessFrame(aecm->aecmCore,
                                        farend_ptr,
                                        &nearendNoisy[FRAME_LEN * i],
                                        (nearendClean
                                         ? &nearendClean[FRAME_LEN * i]
                                         : NULL),
                                        &out[FRAME_LEN * i]) == -1)
                return -1;
        }
    }

#ifdef AEC_DEBUG
    msInAECBuf = (short) WebRtc_available_read(aecm->farendBuf) /
        (kSampMsNb * aecm->aecmCore->mult);
    fwrite(&msInAECBuf, 2, 1, aecm->bufFile);
    fwrite(&(aecm->knownDelay), sizeof(aecm->knownDelay), 1, aecm->delayFile);
#endif

    return retVal;
}